

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O2

void __thiscall
dlib::toggle_button::set_click_handler<dlib::open_file_box_helper::box_win>
          (toggle_button *this,box_win *object,mfp_pointer_type event_handler_)

{
  mfp_pointer_type in_RCX;
  pointer *__ptr;
  _Head_base<0UL,_dlib::any_function<void_(dlib::toggle_button_&),_void,_1UL>::Tbase<void_(dlib::toggle_button_&)>_*,_false>
  local_88;
  auto_mutex M;
  member_function_pointer<dlib::toggle_button_&,_void,_void,_void> local_68;
  
  M.r = (this->super_button_action).super_mouse_over_event.super_drawable.m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  make_mfp<dlib::open_file_box_helper::box_win,dlib::toggle_button&>
            (&local_68,(dlib *)object,(box_win *)event_handler_,in_RCX);
  any_function<void(dlib::toggle_button&),void,1ul>::
  any_function<dlib::member_function_pointer<dlib::toggle_button&,void,void,void>>
            ((any_function<void(dlib::toggle_button&),void,1ul> *)&local_88,&local_68);
  any_function<void_(dlib::toggle_button_&),_void,_1UL>::operator=
            (&this->event_handler_self,
             (any_function<void_(dlib::toggle_button_&),_void,_1UL> *)&local_88);
  if (local_88._M_head_impl != (Tbase<void_(dlib::toggle_button_&)> *)0x0) {
    (*(local_88._M_head_impl)->_vptr_Tbase[1])();
  }
  local_88._M_head_impl = (Tbase<void_(dlib::toggle_button_&)> *)0x0;
  (*(code *)**local_68.super_mfp_kernel_1_base_class<1UL>.mp_memory.data)();
  any_function<void_(),_void,_0UL>::clear(&this->event_handler);
  auto_mutex::~auto_mutex(&M);
  return;
}

Assistant:

void set_click_handler (
            T& object,
            void (T::*event_handler_)(toggle_button&)
        )
        {
            auto_mutex M(m);
            event_handler_self = make_mfp(object,event_handler_);
            event_handler.clear();
        }